

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.cpp
# Opt level: O3

mallinfo * custommallinfo(void)

{
  mallinfo *in_RDI;
  
  in_RDI->hblkhd = 0;
  in_RDI->usmblks = 0;
  in_RDI->fsmblks = 0;
  in_RDI->uordblks = 0;
  in_RDI->arena = 0;
  in_RDI->ordblks = 0;
  in_RDI->smblks = 0;
  in_RDI->hblks = 0;
  in_RDI->fordblks = 0;
  in_RDI->keepcost = 0;
  return in_RDI;
}

Assistant:

struct mallinfo CUSTOM_MALLINFO() {
  // For now, we return useless stats.
  struct mallinfo m;
  m.arena = 0;
  m.ordblks = 0;
  m.smblks = 0;
  m.hblks = 0;
  m.hblkhd = 0;
  m.usmblks = 0;
  m.fsmblks = 0;
  m.uordblks = 0;
  m.fordblks = 0;
  m.keepcost = 0;
  return m;
}